

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

BOOL CONTEXT_SetThreadContext(DWORD dwProcessId,pthread_t self,CONTEXT *lpContext)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  DWORD DVar9;
  long lVar10;
  uint *puVar11;
  char *pcVar12;
  char *__format;
  FILE *__stream;
  uint __errnum;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  DWORD64 local_a8;
  DWORD64 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  DWORD64 local_78;
  DWORD64 DStack_70;
  DWORD64 local_68;
  DWORD64 local_60;
  DWORD64 DStack_58;
  DWORD64 local_48;
  ulong local_40;
  ulong local_38;
  DWORD64 local_30;
  
  if (lpContext == (CONTEXT *)0x0) {
    if (!PAL_InitializeChakraCoreCalled) goto LAB_00150f12;
    DVar9 = 0x3e6;
  }
  else {
    DVar9 = GetCurrentProcessId();
    if (DVar9 == dwProcessId) {
      fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/context.cpp"
              ,0x1e9,"0","");
      fflush(_stderr);
LAB_00150f12:
      abort();
    }
    if ((lpContext->ContextFlags & 3) == 0) {
      return 1;
    }
    lVar10 = ptrace(PTRACE_GETREGS,dwProcessId,local_c8,0);
    if (lVar10 == -1) {
      fprintf(_stderr,"] %s %s:%d","CONTEXT_SetThreadContext",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/context.cpp"
              ,0x1fa);
      __stream = _stderr;
      puVar11 = (uint *)__errno_location();
      __errnum = *puVar11;
      pcVar12 = strerror(__errnum);
      __format = "Failed ptrace(PT_GETREGS, processId:%d) errno:%d (%s)\n";
    }
    else {
      if ((lpContext->ContextFlags & 1) != 0) {
        local_a8 = lpContext->Rbp;
        local_48 = lpContext->Rip;
        local_40 = (ulong)lpContext->SegCs;
        local_38 = (ulong)lpContext->EFlags;
        local_30 = lpContext->Rsp;
      }
      if ((lpContext->ContextFlags & 2) != 0) {
        local_60 = lpContext->Rsi;
        DStack_58 = lpContext->Rdi;
        local_a0 = lpContext->Rbx;
        local_68 = lpContext->Rdx;
        local_78 = lpContext->Rax;
        DStack_70 = lpContext->Rcx;
        uVar1 = lpContext->R8;
        uVar5 = lpContext->R9;
        local_88._8_4_ = (int)uVar1;
        local_88._0_8_ = uVar5;
        local_88._12_4_ = (int)((ulong)uVar1 >> 0x20);
        uVar2 = lpContext->R10;
        uVar6 = lpContext->R11;
        local_98._8_4_ = (int)uVar2;
        local_98._0_8_ = uVar6;
        local_98._12_4_ = (int)((ulong)uVar2 >> 0x20);
        uVar3 = lpContext->R12;
        uVar7 = lpContext->R13;
        local_b8._8_4_ = (int)uVar3;
        local_b8._0_8_ = uVar7;
        local_b8._12_4_ = (int)((ulong)uVar3 >> 0x20);
        uVar4 = lpContext->R14;
        uVar8 = lpContext->R15;
        local_c8._8_4_ = (int)uVar4;
        local_c8._0_8_ = uVar8;
        local_c8._12_4_ = (int)((ulong)uVar4 >> 0x20);
      }
      lVar10 = ptrace(PTRACE_SETREGS,dwProcessId,local_c8,0);
      if (lVar10 != -1) {
        return 1;
      }
      fprintf(_stderr,"] %s %s:%d","CONTEXT_SetThreadContext",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/context.cpp"
              ,0x219);
      __stream = _stderr;
      puVar11 = (uint *)__errno_location();
      __errnum = *puVar11;
      pcVar12 = strerror(__errnum);
      __format = "Failed ptrace(PT_SETREGS, processId:%d) errno:%d (%s)\n";
    }
    fprintf(__stream,__format,dwProcessId,(ulong)__errnum,pcVar12);
    DVar9 = 0x54f;
  }
  SetLastError(DVar9);
  return 0;
}

Assistant:

BOOL
CONTEXT_SetThreadContext(
           DWORD dwProcessId,
           pthread_t self,
           CONST CONTEXT *lpContext)
{
    BOOL ret = FALSE;

    if (lpContext == NULL)
    {
        ERROR("Invalid lpContext parameter value\n");
        SetLastError(ERROR_NOACCESS);
        goto EXIT;
    }

    if (dwProcessId != GetCurrentProcessId())
    {
        // GetThreadContext() of a thread in another process
        ASSERT("Cross-process GetThreadContext() is not supported\n");
        SetLastError(ERROR_NOACCESS);
        goto EXIT;
    }

    if (self != pthread_self())
    {
        // hThread is in the current process, but isn't the current
        // thread.  Extract the CONTEXT from the Mach thread.

        mach_port_t mptPort;

        mptPort = pthread_mach_thread_np(self);

        ret = (CONTEXT_SetThreadContextOnPort(mptPort, lpContext) == KERN_SUCCESS);
    }
    else
    {
        MachSetThreadContext(const_cast<CONTEXT *>(lpContext));
        ASSERT("MachSetThreadContext should never return\n");
    }

EXIT:
    return ret;
}